

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O3

Spectrum * __thiscall
phyr::SpecularReflection::sample_f
          (Spectrum *__return_storage_ptr__,SpecularReflection *this,Vector3f *wo,Vector3f *wi,
          Point2f *sample,double *pdf,BxDFType *sampledType)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  double dVar6;
  long lVar7;
  undefined1 auVar8 [16];
  CoefficientSpectrum<60> cs;
  CoefficientSpectrum<60> cs_1;
  double local_5c0 [60];
  undefined1 local_3e0 [480];
  double local_200 [60];
  
  uVar3 = *(uint *)((long)&wo->x + 4);
  uVar4 = *(undefined4 *)&wo->y;
  uVar5 = *(uint *)((long)&wo->y + 4);
  dVar2 = wo->z;
  *(undefined4 *)&wi->x = *(undefined4 *)&wo->x;
  *(uint *)((long)&wi->x + 4) = uVar3 ^ 0x80000000;
  *(undefined4 *)&wi->y = uVar4;
  *(uint *)((long)&wi->y + 4) = uVar5 ^ 0x80000000;
  wi->z = dVar2;
  *pdf = 1.0;
  (**this->fresnel->_vptr_Fresnel)(wi->z,local_200);
  lVar7 = 0;
  memset(local_5c0,0,0x1e0);
  do {
    dVar2 = local_200[lVar7 + 1];
    pdVar1 = (this->R).super_CoefficientSpectrum<60>.samples + lVar7;
    dVar6 = pdVar1[1];
    local_5c0[lVar7] = *pdVar1 * local_200[lVar7];
    local_5c0[lVar7 + 1] = dVar6 * dVar2;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0x3c);
  dVar2 = wi->z;
  lVar7 = 0;
  memset(local_3e0,0,0x1e0);
  do {
    auVar8._8_8_ = ABS(dVar2);
    auVar8._0_8_ = ABS(dVar2);
    auVar8 = divpd(*(undefined1 (*) [16])(local_5c0 + lVar7),auVar8);
    *(undefined1 (*) [16])(local_3e0 + lVar7 * 8) = auVar8;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0x3c);
  memcpy(__return_storage_ptr__,local_3e0,0x1e0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum SpecularReflection::sample_f(const Vector3f& wo, Vector3f* wi,
                                      const Point2f& sample, Real* pdf,
                                      BxDFType* sampledType) const {
    // Compute perfect specular reflection direction.
    // According to the shading coordinate space, n = (0, 0, 1),
    // so calculating the reflection vector for {wo} over {n}
    // is simplified to the following.
    *wi = Vector3f(-wo.x, -wo.y, wo.z);
    *pdf = 1;
    return fresnel->evaluate(cosTheta(*wi)) * R / absCosTheta(*wi);
}